

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsModuleCompiler::SetupLocalVariables(AsmJsModuleCompiler *this,AsmJsFunc *func)

{
  TypedRegisterAllocator *this_00;
  OpCode OVar1;
  ParseNode *this_01;
  long lVar2;
  double dVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  Which WVar8;
  int iVar9;
  Types TVar10;
  RegSlot RVar11;
  uint uVar12;
  RegSlot RVar13;
  RegSlot RVar14;
  undefined4 *puVar15;
  ParseNodeBin *pPVar16;
  ParseNodeVar *pPVar17;
  AsmJsFunctionDeclaration *sym;
  ParseNodeUni *pPVar18;
  AsmJsSymbol *sym_00;
  IdentPtr pIVar19;
  AsmJsVarBase *pAVar20;
  RegisterSpace *pRVar21;
  ParseNodeInt *pPVar22;
  RegSlot *pRVar23;
  ParseNodeFloat *pPVar24;
  ParseNodeCall *pPVar25;
  AsmJsMathConst *pAVar26;
  AsmJsVar *pAVar27;
  int64 i64y;
  byte bVar28;
  ParseNode *pPVar29;
  char16_t *pcVar30;
  uint uVar31;
  ParseNodePtr this_02;
  uint uVar32;
  byte unaff_R14B;
  ParseNodePtr this_03;
  ParseNodePtr pPVar33;
  undefined4 uVar34;
  undefined1 auStack_98 [8];
  BVSparse<Memory::ArenaAllocator> initializerBV;
  long i64;
  RegisterSpace *local_48;
  AsmJsType local_34;
  
  pPVar29 = func->mBodyNode;
  initializerBV.alloc = (Type)auStack_98;
  auStack_98 = (undefined1  [8])0x0;
  initializerBV.head = (Type)0x0;
  this_00 = &func->mTypedRegisterAllocator;
  initializerBV.lastFoundIndex = (Type)this;
  puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (pPVar29->nop != knopList) {
      bVar28 = 1;
      goto LAB_0095a334;
    }
    pPVar16 = ParseNode::AsParseNodeBin(pPVar29);
    this_03 = pPVar16->pnode1;
    initializerBV.lastUsedNodePrevNextField = (Type)pPVar29;
    do {
      pPVar29 = (ParseNode *)initializerBV.lastUsedNodePrevNextField;
      if (this_03 == (ParseNode *)0x0) {
LAB_0095a2eb:
        pPVar16 = ParseNode::AsParseNodeBin((ParseNode *)initializerBV.lastUsedNodePrevNextField);
        iVar9 = 3;
        if (pPVar16->pnode2->nop != knopEndCode) {
          pPVar16 = ParseNode::AsParseNodeBin(pPVar29);
          pPVar29 = pPVar16->pnode2;
          iVar9 = 0;
        }
        goto LAB_0095a31e;
      }
      if (this_03->nop == knopList) {
        pPVar16 = ParseNode::AsParseNodeBin(this_03);
        this_02 = pPVar16->pnode1;
        pPVar16 = ParseNode::AsParseNodeBin(this_03);
        pPVar33 = pPVar16->pnode2;
      }
      else {
        if (this_03->nop == knopEndCode) goto LAB_0095a2eb;
        pPVar33 = (ParseNodePtr)0x0;
        this_02 = this_03;
      }
      if (this_02->nop == knopVarDecl) {
        pPVar17 = ParseNode::AsParseNodeVar(this_02);
        pPVar29 = pPVar17->pnodeInit;
        pcVar30 = L"The righthand side of a var declaration missing an initialization (empty)";
        if (pPVar29 != (ParseNode *)0x0) {
          OVar1 = pPVar29->nop;
          sym_00 = (AsmJsSymbol *)0x0;
          bVar7 = false;
          if (OVar1 < knopFlt) {
            if (OVar1 == knopName) {
              pIVar19 = ParseNode::name(pPVar29);
              sym_00 = LookupIdentifier(this,pIVar19,func,(Source *)0x0);
              pcVar30 = L"Var declaration with non-constant";
              if ((sym_00 != (AsmJsSymbol *)0x0) &&
                 ((sym_00->mType == Variable ||
                  ((pcVar30 = L"Var declaration with non-constant", sym_00 != (AsmJsSymbol *)0x0 &&
                   (pcVar30 = L"Var declaration with non-constant", sym_00->mType == MathConstant)))
                  ))) {
                iVar9 = (*sym_00->_vptr_AsmJsSymbol[1])(sym_00);
                pcVar30 = L"Var declaration with non-constant";
                if ((char)iVar9 == '\0') {
                  bVar7 = false;
                  goto LAB_00959987;
                }
              }
            }
            else {
              pcVar30 = L"Var declaration with something else than a literal value|fround call";
              if (OVar1 == knopInt) goto LAB_00959987;
            }
          }
          else {
            if (OVar1 == knopFlt) {
LAB_00959987:
              pIVar19 = ParseNode::name(this_02);
              bVar5 = AsmJSCompiler::CheckIdentifier(this,this_02,pIVar19);
              if (!bVar5) {
                sym_00 = (AsmJsSymbol *)0x0;
                unaff_R14B = 0;
                goto LAB_00959977;
              }
              pIVar19 = ParseNode::name(this_02);
              pAVar20 = AsmJsFunc::DefineVar(func,pIVar19,false,true);
              pcVar30 = L"Failed to define var";
              if (pAVar20 != (AsmJsVarBase *)0x0) {
                BVar6 = BVSparse<Memory::ArenaAllocator>::Test
                                  ((BVSparse<Memory::ArenaAllocator> *)auStack_98,
                                   ((pAVar20->super_AsmJsSymbol).mName)->m_propertyId);
                pcVar30 = L"Cannot declare a var after using it in an initializer";
                if (BVar6 == '\0') {
                  if (pPVar29->nop != knopFlt) {
                    if (pPVar29->nop != knopInt) goto LAB_00959c25;
                    AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
                    (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                    TVar10 = WAsmJs::FromPrimitiveType<int>();
                    pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                    RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar21);
                    pAVar20->mLocation = RVar11;
                    pPVar22 = ParseNode::AsParseNodeInt(pPVar29);
                    *(int32 *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol = pPVar22->lw;
                    pPVar22 = ParseNode::AsParseNodeInt(pPVar29);
                    iVar9 = pPVar22->lw;
                    TVar10 = WAsmJs::FromPrimitiveType<int>();
                    local_48 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                    lVar2 = *(long *)&local_48[1].mFirstTmpReg;
                    uVar32 = 0;
                    if (lVar2 != 0) {
                      uVar12 = JsUtil::
                               BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               ::GetBucket(iVar9 * 2 + 1,local_48[2].mNbConst,
                                           local_48[3].mNextLocation);
                      uVar31 = *(uint *)(lVar2 + (ulong)uVar12 * 4);
                      if (-1 < (int)uVar31) {
                        uVar32 = 0;
                        do {
                          if (*(int *)(*(long *)&local_48[1].mNbConst + 8 + (ulong)uVar31 * 0xc) ==
                              iVar9) {
                            if (*(DictionaryStats **)&local_48[3].mNbConst != (DictionaryStats *)0x0
                               ) {
                              DictionaryStats::Lookup
                                        (*(DictionaryStats **)&local_48[3].mNbConst,uVar32);
                            }
                            goto LAB_00959b05;
                          }
                          uVar32 = uVar32 + 1;
                          uVar31 = *(uint *)(*(long *)&local_48[1].mNbConst + (ulong)uVar31 * 0xc +
                                            4);
                        } while (-1 < (int)uVar31);
                      }
                    }
                    uVar31 = 0xffffffff;
                    if (*(DictionaryStats **)&local_48[3].mNbConst != (DictionaryStats *)0x0) {
                      DictionaryStats::Lookup(*(DictionaryStats **)&local_48[3].mNbConst,uVar32);
                    }
LAB_00959b05:
                    if ((int)uVar31 < 0) {
LAB_00959c17:
                      pRVar23 = &Constants::NoRegister;
                    }
                    else {
                      pRVar23 = (RegSlot *)((ulong)uVar31 * 0xc + *(long *)&local_48[1].mNbConst);
                    }
                    RVar13 = *pRVar23;
                    goto LAB_0095a1d4;
                  }
                  pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                  if ((pPVar24->field_0x18 & 1) != 0) {
                    pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                    if ((pPVar24->dbl != -2147483648.0) || (NAN(pPVar24->dbl))) goto LAB_00959c25;
                    AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
                    (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                    TVar10 = WAsmJs::FromPrimitiveType<int>();
                    pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                    RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar21);
                    pAVar20->mLocation = RVar11;
                    *(undefined4 *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 0x80000000;
                    TVar10 = WAsmJs::FromPrimitiveType<int>();
                    pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                    lVar2 = *(long *)&pRVar21[1].mFirstTmpReg;
                    uVar32 = 0;
                    if (lVar2 != 0) {
                      uVar12 = JsUtil::
                               BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               ::GetBucket(1,pRVar21[2].mNbConst,pRVar21[3].mNextLocation);
                      uVar31 = *(uint *)(lVar2 + (ulong)uVar12 * 4);
                      if (-1 < (int)uVar31) {
                        uVar32 = 0;
                        do {
                          uVar32 = uVar32 + 1;
                          uVar31 = *(uint *)(*(long *)&pRVar21[1].mNbConst + (ulong)uVar31 * 0xc + 4
                                            );
                        } while (-1 < (int)uVar31);
                      }
                    }
                    if (*(DictionaryStats **)&pRVar21[3].mNbConst != (DictionaryStats *)0x0) {
                      DictionaryStats::Lookup(*(DictionaryStats **)&pRVar21[3].mNbConst,uVar32);
                    }
                    goto LAB_00959c17;
                  }
LAB_00959c25:
                  if ((((pPVar29->nop == knopFlt) &&
                       (pPVar24 = ParseNode::AsParseNodeFloat(pPVar29),
                       (pPVar24->field_0x18 & 1) != 0)) &&
                      (pPVar24 = ParseNode::AsParseNodeFloat(pPVar29), 2147483647.0 < pPVar24->dbl))
                     && (pPVar24 = ParseNode::AsParseNodeFloat(pPVar29),
                        pPVar24->dbl <= 4294967295.0)) {
                    AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
                    (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                    TVar10 = WAsmJs::FromPrimitiveType<int>();
                    pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                    RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar21);
                    pAVar20->mLocation = RVar11;
                    pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                    *(int *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                         (int)(long)pPVar24->dbl;
                    pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                    dVar3 = pPVar24->dbl;
                    TVar10 = WAsmJs::FromPrimitiveType<int>();
                    local_48 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                    lVar2 = *(long *)&local_48[1].mFirstTmpReg;
                    uVar32 = 0;
                    if (lVar2 != 0) {
                      iVar9 = (int)(long)dVar3;
                      uVar12 = JsUtil::
                               BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               ::GetBucket(iVar9 * 2 + 1,local_48[2].mNbConst,
                                           local_48[3].mNextLocation);
                      uVar31 = *(uint *)(lVar2 + (ulong)uVar12 * 4);
                      if (-1 < (int)uVar31) {
                        uVar32 = 0;
                        do {
                          if (*(int *)(*(long *)&local_48[1].mNbConst + 8 + (ulong)uVar31 * 0xc) ==
                              iVar9) {
                            if (*(DictionaryStats **)&local_48[3].mNbConst != (DictionaryStats *)0x0
                               ) {
                              DictionaryStats::Lookup
                                        (*(DictionaryStats **)&local_48[3].mNbConst,uVar32);
                            }
                            goto LAB_00959b05;
                          }
                          uVar32 = uVar32 + 1;
                          uVar31 = *(uint *)(*(long *)&local_48[1].mNbConst + (ulong)uVar31 * 0xc +
                                            4);
                        } while (-1 < (int)uVar31);
                      }
                    }
                    uVar31 = 0xffffffff;
                    if (*(DictionaryStats **)&local_48[3].mNbConst != (DictionaryStats *)0x0) {
                      DictionaryStats::Lookup(*(DictionaryStats **)&local_48[3].mNbConst,uVar32);
                    }
                    goto LAB_00959b05;
                  }
                  OVar1 = pPVar29->nop;
                  if (OVar1 == knopName) {
                    if ((sym_00 == (AsmJsSymbol *)0x0) || (sym_00->mType != Variable)) {
                      local_34.which_ = (**sym_00->_vptr_AsmJsSymbol)(sym_00);
                      RVar13 = 0xffffffff;
                      bVar7 = AsmJsType::operator==(&local_34,(AsmJsType)0x2);
                      if (!bVar7) {
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *puVar15 = 1;
                        bVar7 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                                  ,0x395,"(declSym->GetType() == AsmJsType::Double)"
                                                  ,"declSym->GetType() == AsmJsType::Double");
                        if (!bVar7) goto LAB_0095a354;
                        *puVar15 = 0;
                      }
                      pAVar26 = AsmJsMathConst::FromSymbol(sym_00);
                      AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
                      (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                      TVar10 = WAsmJs::FromPrimitiveType<double>();
                      pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                      RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar21);
                      pAVar20->mLocation = RVar11;
                      iVar9 = SUB84(*pAVar26->mVal,0);
                      uVar34 = (undefined4)((ulong)*pAVar26->mVal >> 0x20);
LAB_0095a0a0:
                      pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                           (_func_int **)CONCAT44(uVar34,iVar9);
                    }
                    else {
                      pAVar27 = AsmJsVar::FromSymbol(sym_00);
                      RVar13 = 0xffffffff;
                      BVSparse<Memory::ArenaAllocator>::Set
                                ((BVSparse<Memory::ArenaAllocator> *)auStack_98,
                                 ((pAVar27->super_AsmJsVarBase).super_AsmJsSymbol.mName)->
                                 m_propertyId);
                      local_34.which_._0_1_ =
                           (pAVar27->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
                      WVar8 = AsmJsVarType::which((AsmJsVarType *)&local_34);
                      if (WVar8 == Int) {
                        AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
                        (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                        RVar14 = AsmJsFunc::AcquireRegister<int>(func);
                        pAVar20->mLocation = RVar14;
                        *(float *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                             (pAVar27->mConstInitialiser).floatVal;
                      }
                      else {
                        if (WVar8 == Double) {
                          AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
                          (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                          RVar14 = AsmJsFunc::AcquireRegister<double>(func);
                          pAVar20->mLocation = RVar14;
                          iVar9 = (pAVar27->mConstInitialiser).intVal;
                          uVar34 = SUB84(pAVar27->mConstInitialiser,4);
                          goto LAB_0095a0a0;
                        }
                        if (WVar8 != Float) {
                          AssertCount = AssertCount + 1;
                          Throw::LogAssert();
                          *puVar15 = 1;
                          bVar7 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                                  ,0x390,"((0))","(0)");
                          goto LAB_00959f3a;
                        }
                        AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Float);
                        (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                        RVar14 = AsmJsFunc::AcquireRegister<float>(func);
                        pAVar20->mLocation = RVar14;
                        *(float *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                             (pAVar27->mConstInitialiser).floatVal;
                      }
                    }
LAB_0095a1d4:
                    sym_00 = (AsmJsSymbol *)&DAT_00000001;
                    if ((RVar13 != 0xffffffff) ||
                       (pcVar30 = L"Cannot find Register constant for var", pPVar29->nop == knopName
                       )) goto LAB_00959977;
                  }
                  else {
                    if (OVar1 == knopCall) {
                      if (bVar7) {
                        AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Float);
                        (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                        TVar10 = WAsmJs::FromPrimitiveType<float>();
                        pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                        RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar21);
                        pAVar20->mLocation = RVar11;
                        pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                        if (pPVar25->pnodeArgs->nop == knopInt) {
                          pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                          pPVar22 = ParseNode::AsParseNodeInt(pPVar25->pnodeArgs);
                          iVar9 = pPVar22->lw;
                          *(float *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (float)iVar9;
                          RVar13 = AsmJsFunc::GetConstRegister<float>(func,(float)iVar9);
                        }
                        else {
                          pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                          bVar7 = ParserWrapper::IsNegativeZero(pPVar25->pnodeArgs);
                          if (bVar7) {
                            *(undefined4 *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                                 0x80000000;
                            RVar13 = AsmJsFunc::GetConstRegister<float>(func,-0.0);
                          }
                          else {
                            pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                            if (pPVar25->pnodeArgs->nop != knopFlt) {
                              AssertCount = AssertCount + 1;
                              Throw::LogAssert();
                              *puVar15 = 1;
                              bVar7 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                                  ,0x3b2,
                                                  "(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt)"
                                                  ,
                                                  "pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt"
                                                  );
                              if (!bVar7) goto LAB_0095a354;
                              *puVar15 = 0;
                            }
                            pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                            pPVar24 = ParseNode::AsParseNodeFloat(pPVar25->pnodeArgs);
                            dVar3 = pPVar24->dbl;
                            *(float *)&pAVar20[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (float)dVar3
                            ;
                            RVar13 = AsmJsFunc::GetConstRegister<float>(func,(float)dVar3);
                          }
                        }
                      }
                      else {
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *puVar15 = 1;
                        bVar7 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                                  ,0x3ba,"((0))","UNREACHED");
LAB_00959f3a:
                        RVar13 = 0xffffffff;
                        if (bVar7 == false) {
LAB_0095a354:
                          pcVar4 = (code *)invalidInstructionException();
                          (*pcVar4)();
                        }
                        *puVar15 = 0;
                      }
                      goto LAB_0095a1d4;
                    }
                    RVar13 = 0xffffffff;
                    if (OVar1 != knopFlt) goto LAB_0095a1d4;
                    pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                    pcVar30 = L"Var declaration with integer literal outside range [-2^31, 2^32)";
                    if ((pPVar24->field_0x18 & 1) == 0) {
                      AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
                      (pAVar20->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                      TVar10 = WAsmJs::FromPrimitiveType<double>();
                      pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                      RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar21);
                      pAVar20->mLocation = RVar11;
                      pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                      dVar3 = pPVar24->dbl;
                      TVar10 = WAsmJs::FromPrimitiveType<double>();
                      pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
                      lVar2 = *(long *)&pRVar21[1].mFirstTmpReg;
                      uVar32 = 0;
                      if (lVar2 != 0) {
                        uVar12 = JsUtil::
                                 BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                 ::GetBucket(((uint)((ulong)dVar3 >> 0x20) ^ SUB84(dVar3,0)) * 2 + 1
                                             ,pRVar21[2].mNbConst,pRVar21[3].mNextLocation);
                        uVar31 = *(uint *)(lVar2 + (ulong)uVar12 * 4);
                        if (-1 < (int)uVar31) {
                          uVar32 = 0;
                          do {
                            if (*(double *)
                                 (*(long *)&pRVar21[1].mNbConst + 8 + (ulong)uVar31 * 0x10) == dVar3
                               ) {
                              if (*(DictionaryStats **)&pRVar21[3].mNbConst !=
                                  (DictionaryStats *)0x0) {
                                DictionaryStats::Lookup
                                          (*(DictionaryStats **)&pRVar21[3].mNbConst,uVar32);
                              }
                              goto LAB_00959d85;
                            }
                            uVar32 = uVar32 + 1;
                            uVar31 = *(uint *)((ulong)uVar31 * 0x10 + *(long *)&pRVar21[1].mNbConst
                                              + 4);
                          } while (-1 < (int)uVar31);
                        }
                      }
                      uVar31 = 0xffffffff;
                      if (*(DictionaryStats **)&pRVar21[3].mNbConst != (DictionaryStats *)0x0) {
                        DictionaryStats::Lookup(*(DictionaryStats **)&pRVar21[3].mNbConst,uVar32);
                      }
LAB_00959d85:
                      if ((int)uVar31 < 0) {
                        pRVar23 = &Constants::NoRegister;
                      }
                      else {
                        pRVar23 = (RegSlot *)((ulong)uVar31 * 0x10 + *(long *)&pRVar21[1].mNbConst);
                      }
                      RVar13 = *pRVar23;
                      pPVar24 = ParseNode::AsParseNodeFloat(pPVar29);
                      iVar9 = SUB84(pPVar24->dbl,0);
                      uVar34 = (undefined4)((ulong)pPVar24->dbl >> 0x20);
                      goto LAB_0095a0a0;
                    }
                  }
                  sym_00 = (AsmJsSymbol *)0x0;
                  AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar30);
                  unaff_R14B = 0;
                  goto LAB_00959977;
                }
              }
              sym_00 = (AsmJsSymbol *)0x0;
              AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar30);
              unaff_R14B = 0;
              goto LAB_00959977;
            }
            pcVar30 = L"Var declaration with something else than a literal value|fround call";
            if (OVar1 == knopCall) {
              pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
              pcVar30 = L"Var declaration with something else than a literal value|fround call";
              if (pPVar25->pnodeTarget->nop == knopName) {
                pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                pIVar19 = ParseNode::name(pPVar25->pnodeTarget);
                sym = LookupIdentifier<Js::AsmJsFunctionDeclaration>(this,pIVar19);
                pcVar30 = L"Cannot resolve function name";
                if ((sym == (AsmJsFunctionDeclaration *)0x0) ||
                   (pcVar30 = L"Unknown function call on var declaration",
                   (sym->super_AsmJsSymbol).mType != MathBuiltinFunction)) {
LAB_009598d0:
                  bVar7 = false;
                  AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar30);
                  unaff_R14B = 0;
                }
                else {
                  bVar7 = AsmJsMathFunction::IsFround(sym);
                  pcVar30 = L"Var declaration with something else than a literal value|fround call";
                  if (!bVar7) goto LAB_009598d0;
                  pPVar25 = ParseNode::AsParseNodeCall(pPVar29);
                  this_01 = pPVar25->pnodeArgs;
                  pcVar30 = L"Var declaration with something else than a literal value|fround call";
                  if (this_01 == (ParseNode *)0x0) goto LAB_009598d0;
                  bVar7 = true;
                  if ((this_01->nop != knopInt) && (this_01->nop != knopFlt)) {
                    pcVar30 = 
                    L"Var declaration with something else than a literal value|fround call";
                    if (this_01->nop == knopNeg) {
                      pPVar18 = ParseNode::AsParseNodeUni(this_01);
                      pcVar30 = 
                      L"Var declaration with something else than a literal value|fround call";
                      if (pPVar18->pnode1->nop == knopInt) {
                        pPVar18 = ParseNode::AsParseNodeUni(this_01);
                        pPVar22 = ParseNode::AsParseNodeInt(pPVar18->pnode1);
                        pcVar30 = 
                        L"Var declaration with something else than a literal value|fround call";
                        if (pPVar22->lw == 0) goto LAB_009598eb;
                      }
                    }
                    goto LAB_009598d0;
                  }
                }
LAB_009598eb:
                sym_00 = (AsmJsSymbol *)0x0;
                if (!bVar7) goto LAB_00959977;
                goto LAB_00959987;
              }
            }
          }
        }
        sym_00 = (AsmJsSymbol *)0x0;
        AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar30);
        unaff_R14B = 0;
      }
      else {
        unaff_R14B = 1;
        sym_00 = (AsmJsSymbol *)0x0;
      }
LAB_00959977:
      this_03 = pPVar33;
    } while ((char)sym_00 != '\0');
    iVar9 = 1;
    pPVar29 = (ParseNode *)initializerBV.lastUsedNodePrevNextField;
LAB_0095a31e:
  } while (iVar9 == 0);
  bVar28 = 1;
  if (iVar9 != 3) {
    bVar28 = unaff_R14B;
  }
LAB_0095a334:
  BVSparse<Memory::ArenaAllocator>::~BVSparse((BVSparse<Memory::ArenaAllocator> *)auStack_98);
  return (bool)(bVar28 & 1);
}

Assistant:

bool AsmJsModuleCompiler::SetupLocalVariables(AsmJsFunc * func)
    {
        ParseNodePtr pnode = func->GetBodyNode();
        MathBuiltin mathBuiltin;
        // define all variables
        BVSparse<ArenaAllocator> initializerBV(&mAllocator);
        while (pnode->nop == knopList)
        {
            ParseNode * varNode = ParserWrapper::GetBinaryLeft(pnode);
            while (varNode && varNode->nop != knopEndCode)
            {
                ParseNode * decl;
                if (varNode->nop == knopList)
                {
                    decl = ParserWrapper::GetBinaryLeft(varNode);
                    varNode = ParserWrapper::GetBinaryRight(varNode);
                }
                else
                {
                    decl = varNode;
                    varNode = nullptr;
                }
                // if we have hit a non-declaration, we are done processing the function header
                if (decl->nop != knopVarDecl)
                {
                    return true;
                }
                ParseNode* pnodeInit = decl->AsParseNodeVar()->pnodeInit;
                AsmJsSymbol * declSym = nullptr;

                bool isFroundInit = false;
                if (!pnodeInit)
                {
                    return Fail(decl, _u("The righthand side of a var declaration missing an initialization (empty)"));
                }

                if (pnodeInit->nop == knopName)
                {
                    declSym = LookupIdentifier(pnodeInit->name(), func);
                    if ((!AsmJsVar::Is(declSym) && !AsmJsMathConst::Is(declSym)) || declSym->isMutable())
                    {
                        return Fail(decl, _u("Var declaration with non-constant"));
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (pnodeInit->AsParseNodeCall()->pnodeTarget->nop != knopName)
                    {
                        return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                    }
                    AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(pnodeInit->AsParseNodeCall()->pnodeTarget->name());

                    if (!funcDecl)
                        return Fail(pnodeInit, _u("Cannot resolve function name"));

                    if (AsmJsMathFunction::Is(funcDecl))
                    {
                        if (!AsmJsMathFunction::IsFround(funcDecl) || !ParserWrapper::IsFroundNumericLiteral(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                        }
                        isFroundInit = true;
                    }
                    else
                    {
                        return Fail(varNode, _u("Unknown function call on var declaration"));
                    }
                }
                else if (pnodeInit->nop != knopInt && pnodeInit->nop != knopFlt)
                {
                    return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                }
                if (!AsmJSCompiler::CheckIdentifier(*this, decl, decl->name()))
                {
                    // CheckIdentifier will print failure message
                    return false;
                }

                AsmJsVar* var = (AsmJsVar*)func->DefineVar(decl->name(), false);
                if (!var)
                {
                    return Fail(decl, _u("Failed to define var"));
                }
                // If we are declaring a var that we previously used in an initializer, that value will be undefined
                // so we need to throw an error.
                if (initializerBV.Test(var->GetName()->GetPropertyId()))
                {
                    return Fail(decl, _u("Cannot declare a var after using it in an initializer"));
                }
                RegSlot loc = Constants::NoRegister;
                if (pnodeInit->nop == knopInt)
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(pnodeInit->AsParseNodeInt()->lw);
                    loc = func->GetConstRegister<int>(pnodeInit->AsParseNodeInt()->lw);
                }
                else if (ParserWrapper::IsMinInt(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(INT_MIN);
                    loc = func->GetConstRegister<int>(INT_MIN);
                }
                else if (ParserWrapper::IsUnsigned(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser((int)((uint32)pnodeInit->AsParseNodeFloat()->dbl));
                    loc = func->GetConstRegister<int>((uint32)pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopFlt)
                {
                    if (pnodeInit->AsParseNodeFloat()->maybeInt)
                    {
                        return Fail(decl, _u("Var declaration with integer literal outside range [-2^31, 2^32)"));
                    }
                    var->SetVarType(AsmJsVarType::Double);
                    var->SetLocation(func->AcquireRegister<double>());
                    loc = func->GetConstRegister<double>(pnodeInit->AsParseNodeFloat()->dbl);
                    var->SetConstInitialiser(pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopName)
                {
                    if (AsmJsVar::Is(declSym))
                    {
                        AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                        initializerBV.Set(definition->GetName()->GetPropertyId());
                        switch (definition->GetVarType().which())
                        {
                        case AsmJsVarType::Double:
                            var->SetVarType(AsmJsVarType::Double);
                            var->SetLocation(func->AcquireRegister<double>());
                            var->SetConstInitialiser(definition->GetDoubleInitialiser());
                            break;

                        case AsmJsVarType::Float:
                            var->SetVarType(AsmJsVarType::Float);
                            var->SetLocation(func->AcquireRegister<float>());
                            var->SetConstInitialiser(definition->GetFloatInitialiser());
                            break;

                        case AsmJsVarType::Int:
                            var->SetVarType(AsmJsVarType::Int);
                            var->SetLocation(func->AcquireRegister<int>());
                            var->SetConstInitialiser(definition->GetIntInitialiser());
                            break;

                        default:
                            Assume(UNREACHED);
                        }
                    }
                    else
                    {
                        Assert(declSym->GetType() == AsmJsType::Double);

                        AsmJsMathConst * definition = AsmJsMathConst::FromSymbol(declSym);

                        var->SetVarType(AsmJsVarType::Double);
                        var->SetLocation(func->AcquireRegister<double>());
                        var->SetConstInitialiser(*definition->GetVal());
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (isFroundInit)
                    {
                        var->SetVarType(AsmJsVarType::Float);
                        var->SetLocation(func->AcquireRegister<float>());
                        if (pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopInt)
                        {
                            int iVal = pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeInt()->lw;
                            var->SetConstInitialiser((float)iVal);
                            loc = func->GetConstRegister<float>((float)iVal);
                        }
                        else if (ParserWrapper::IsNegativeZero(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            var->SetConstInitialiser(-0.0f);
                            loc = func->GetConstRegister<float>(-0.0f);
                        }
                        else
                        {
                            // note: fround((-)NumericLiteral) is explicitly allowed for any range, so we do not need to check for maybeInt
                            Assert(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt);
                            float fVal = (float)pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeFloat()->dbl;
                            var->SetConstInitialiser((float)fVal);
                            loc = func->GetConstRegister<float>(fVal);
                        }
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }
                }

                if (loc == Constants::NoRegister && pnodeInit->nop != knopName)
                {
                    return Fail(decl, _u("Cannot find Register constant for var"));
                }
            }

            if (ParserWrapper::GetBinaryRight(pnode)->nop == knopEndCode)
            {
                break;
            }
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }
        return true;
    }